

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearObjectAppearance.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::LinearObjectAppearance::SetOpacity(LinearObjectAppearance *this,KUINT8 O)

{
  KException *this_00;
  KString local_40;
  
  if (O < 0x65) {
    (this->super_ObjectAppearance).field_0xc = O;
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"SetOpacity","");
  KException::KException<char_const*>(this_00,&local_40,8,"Acceptable values are 0-100.");
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void LinearObjectAppearance::SetOpacity(KUINT8 O) noexcept(false)
{
    if( O > 100 ) throw KException( __FUNCTION__, INVALID_DATA, "Acceptable values are 0-100." );

    m_SpecificAppearanceUnion.m_ExhaustSmoke.m_ui32Opacity = O;
}